

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Elf64.cpp
# Opt level: O2

Elf64_Ehdr * elf::arch64::GetHeader(void *data)

{
  uint8_t uVar1;
  Elf64_Ehdr *pEVar2;
  Elf64_Ehdr *ret;
  
  if (*data != 0x464c457f) {
    return (Elf64_Ehdr *)0x0;
  }
  uVar1 = GetClass(data);
  pEVar2 = (Elf64_Ehdr *)0x0;
  if (uVar1 == '\x02') {
    pEVar2 = (Elf64_Ehdr *)data;
  }
  return pEVar2;
}

Assistant:

Elf64_Ehdr* elf::arch64::GetHeader(void* data) {
    Elf64_Ehdr* ret = (Elf64_Ehdr*) data;

    if(memcmp(ret->e_ident, ELFMAG, SELFMAG) != 0)
        return NULL; // Invalid ELF

    if(GetClass(data) != ELFCLASS64)
        return NULL; // x64 only

    return ret;
}